

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void percent_rankValueFunc(sqlite3_context *pCtx)

{
  long *plVar1;
  double r;
  CallCount *p;
  sqlite3_context *pCtx_local;
  
  plVar1 = (long *)sqlite3_aggregate_context(pCtx,0x18);
  if (plVar1 != (long *)0x0) {
    *plVar1 = plVar1[1];
    if (plVar1[2] < 2) {
      sqlite3_result_double(pCtx,0.0);
    }
    else {
      sqlite3_result_double(pCtx,(double)*plVar1 / (double)(plVar1[2] + -1));
    }
  }
  return;
}

Assistant:

static void percent_rankValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    p->nValue = p->nStep;
    if( p->nTotal>1 ){
      double r = (double)p->nValue / (double)(p->nTotal-1);
      sqlite3_result_double(pCtx, r);
    }else{
      sqlite3_result_double(pCtx, 0.0);
    }
  }
}